

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fad.h
# Opt level: O3

Fad<double> * __thiscall
Fad<double>::operator=
          (Fad<double> *this,
          FadExpr<FadBinaryMul<Fad<double>,_FadExpr<FadBinaryAdd<FadCst<int>,_FadExpr<FadBinaryMul<FadCst<int>,_Fad<double>_>_>_>_>_>_>
          *fadexpr)

{
  uint uVar1;
  uint uVar2;
  int iVar3;
  FadExpr<FadBinaryAdd<FadCst<int>,_FadExpr<FadBinaryMul<FadCst<int>,_Fad<double>_>_>_>_> *pFVar4;
  FadExpr<FadBinaryMul<FadCst<int>,_Fad<double>_>_> *pFVar5;
  Fad<double> *pFVar6;
  double *pdVar7;
  double *pdVar8;
  uint uVar9;
  double *pdVar10;
  ulong uVar11;
  Fad<double> *pFVar12;
  value_type vVar13;
  double dVar14;
  
  pFVar12 = (fadexpr->fadexpr_).left_;
  uVar9 = (pFVar12->dx_).num_elts;
  uVar1 = (((((((fadexpr->fadexpr_).right_)->fadexpr_).right_)->fadexpr_).right_)->dx_).num_elts;
  if ((int)uVar1 < (int)uVar9) {
    uVar1 = uVar9;
  }
  uVar2 = (this->dx_).num_elts;
  if (uVar1 == uVar2) {
    if (uVar1 == 0) goto LAB_00faa793;
    pdVar10 = (this->dx_).ptr_to_data;
  }
  else {
    if (uVar1 == 0) {
      if (uVar2 != 0) {
        pdVar10 = (this->dx_).ptr_to_data;
        if (pdVar10 != (double *)0x0) {
          operator_delete__(pdVar10);
        }
        (this->dx_).num_elts = 0;
        (this->dx_).ptr_to_data = (double *)0x0;
      }
      goto LAB_00faa793;
    }
    if (uVar2 != 0) {
      pdVar10 = (this->dx_).ptr_to_data;
      if (pdVar10 != (double *)0x0) {
        operator_delete__(pdVar10);
        pFVar12 = (fadexpr->fadexpr_).left_;
      }
      (this->dx_).ptr_to_data = (double *)0x0;
    }
    (this->dx_).num_elts = uVar1;
    uVar11 = 0xffffffffffffffff;
    if (-1 < (int)uVar1) {
      uVar11 = (ulong)uVar1 << 3;
    }
    pdVar10 = (double *)operator_new__(uVar11);
    (this->dx_).ptr_to_data = pdVar10;
    uVar9 = (pFVar12->dx_).num_elts;
  }
  if (uVar9 != 0) {
    pFVar4 = (fadexpr->fadexpr_).right_;
    pFVar5 = (pFVar4->fadexpr_).right_;
    pFVar6 = (pFVar5->fadexpr_).right_;
    if ((pFVar6->dx_).num_elts != 0) {
      if (0 < (int)uVar1) {
        iVar3 = (pFVar4->fadexpr_).left_.constant_;
        dVar14 = (double)(pFVar5->fadexpr_).left_.constant_;
        pdVar7 = (pFVar12->dx_).ptr_to_data;
        pdVar8 = (pFVar6->dx_).ptr_to_data;
        uVar11 = 0;
        do {
          pdVar10[uVar11] =
               (pFVar6->val_ * dVar14 + (double)iVar3) * pdVar7[uVar11] +
               pdVar8[uVar11] * dVar14 * pFVar12->val_;
          uVar11 = uVar11 + 1;
        } while (uVar1 != uVar11);
      }
      goto LAB_00faa793;
    }
  }
  if (0 < (int)uVar1) {
    uVar11 = 0;
    do {
      vVar13 = FadBinaryMul<Fad<double>,_FadExpr<FadBinaryAdd<FadCst<int>,_FadExpr<FadBinaryMul<FadCst<int>,_Fad<double>_>_>_>_>_>
               ::dx(&fadexpr->fadexpr_,(int)uVar11);
      pdVar10[uVar11] = vVar13;
      uVar11 = uVar11 + 1;
    } while (uVar1 != uVar11);
  }
LAB_00faa793:
  pFVar4 = (fadexpr->fadexpr_).right_;
  pFVar5 = (pFVar4->fadexpr_).right_;
  this->val_ = ((double)(pFVar5->fadexpr_).left_.constant_ * ((pFVar5->fadexpr_).right_)->val_ +
               (double)(pFVar4->fadexpr_).left_.constant_) * ((fadexpr->fadexpr_).left_)->val_;
  return this;
}

Assistant:

inline Fad<T> & Fad<T>::operator=(const FadExpr<ExprT>& fadexpr) 
{
  int sz = fadexpr.size();

  if ( sz != dx_.size() ) dx_.resize(sz);

  if ( sz ) {
    T* RESTRICT dxp = dx_.begin();
    if (fadexpr.hasFastAccess())
      for(int i=0; i<sz; ++i)
	dxp[i] = fadexpr.fastAccessDx(i);
    else
      for(int i=0; i<sz; ++i)
	dxp[i] = fadexpr.dx(i);
  }
  
  val_ = fadexpr.val();
  
  return *this;
}